

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O2

void nn_ep_set_error(nn_ep *self,int errnum)

{
  if (self->last_errno == errnum) {
    return;
  }
  if (self->last_errno == 0) {
    nn_sock_stat_increment(self->sock,0xcb,1);
  }
  self->last_errno = errnum;
  nn_sock_report_error(self->sock,self,errnum);
  return;
}

Assistant:

void nn_ep_set_error(struct nn_ep *self, int errnum)
{
    if (self->last_errno == errnum)
        /*  Error is still there, no need to report it again  */
        return;
    if (self->last_errno == 0)
        nn_sock_stat_increment (self->sock, NN_STAT_CURRENT_EP_ERRORS, 1);
    self->last_errno = errnum;
    nn_sock_report_error (self->sock, self, errnum);
}